

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceDecomposition::unpackSelfData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  uint i;
  long lVar1;
  
  if (&this->selfPot != &sdat->selfPot) {
    lVar1 = 0;
    do {
      (this->selfPot).data_[lVar1] = (sdat->selfPot).data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
  }
  if (&this->selectedSelfPot != &sdat->selePot) {
    lVar1 = 0;
    do {
      (this->selectedSelfPot).data_[lVar1] = (sdat->selePot).data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
  }
  if ((this->atomStorageLayout_ & 0x10000) != 0) {
    (this->snap_->atomData).flucQFrc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[atom] = sdat->flucQfrc;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackSelfData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom] = sdat.flucQfrc;
    }
  }